

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIFileOpenDialog::setDirectoryName(CGUIFileOpenDialog *this,path *name)

{
  path *this_00;
  IFileSystem *pIVar1;
  string<char> local_40;
  
  core::string<char>::operator=(&this->FileDirectory,name);
  this_00 = &this->FileDirectoryFlat;
  core::string<char>::operator=(this_00,name);
  pIVar1 = this->FileSystem;
  core::string<char>::string<char>(&local_40,"/");
  (*pIVar1->_vptr_IFileSystem[0x16])(pIVar1,this_00,&local_40);
  ::std::__cxx11::string::_M_dispose();
  core::multibyteToWString(&this->FileDirectoryFlatW,this_00);
  return;
}

Assistant:

void CGUIFileOpenDialog::setDirectoryName(const irr::io::path &name)
{
	FileDirectory = name;
	FileDirectoryFlat = name;
	FileSystem->flattenFilename(FileDirectoryFlat);
	pathToStringW(FileDirectoryFlatW, FileDirectoryFlat);
}